

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clSetKernelExecInfo(cl_kernel kernel,cl_kernel_exec_info param_name,size_t param_value_size,
                          void *param_value)

{
  time_point end;
  bool bVar1;
  CLIntercept *pCVar2;
  cl_icd_dispatch *pcVar3;
  cl_kernel enqueueCounter_00;
  SConfig *pSVar4;
  undefined8 uVar5;
  void *in_RCX;
  size_t in_RDX;
  cl_kernel_exec_info in_ESI;
  cl_kernel in_RDI;
  cl_int in_stack_000000c4;
  char *in_stack_000000c8;
  CLIntercept *in_stack_000000d0;
  cl_int retVal;
  time_point cpuEnd;
  time_point cpuStart;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 uVar6;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffeb0;
  CLIntercept *in_stack_fffffffffffffeb8;
  cl_kernel kernel_00;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  allocator local_e9;
  string local_e8 [8];
  cl_sync_point_khr *in_stack_ffffffffffffff20;
  cl_event *in_stack_ffffffffffffff28;
  cl_int in_stack_ffffffffffffff34;
  CLIntercept *in_stack_ffffffffffffff38;
  CLIntercept *in_stack_ffffffffffffff40;
  allocator in_stack_ffffffffffffff4f;
  string *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  CLIntercept *in_stack_ffffffffffffff60;
  time_point in_stack_ffffffffffffff68;
  time_point in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  time_point in_stack_ffffffffffffff80;
  CLIntercept *local_70;
  string local_58 [8];
  void *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  cl_kernel_exec_info in_stack_ffffffffffffffc4;
  cl_kernel kernel_01;
  CLIntercept *this;
  cl_int local_4;
  
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  pCVar2 = GetIntercept();
  if ((pCVar2 == (CLIntercept *)0x0) ||
     (pcVar3 = CLIntercept::dispatch(pCVar2),
     pcVar3->clSetKernelExecInfo == (cl_api_clSetKernelExecInfo)0x0)) {
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,(int *)&stack0xfffffffffffffefc)
    ;
    local_4 = -0x30;
  }
  else {
    enqueueCounter_00 = (cl_kernel)CLIntercept::getEnqueueCounter(in_stack_fffffffffffffeb8);
    pSVar4 = CLIntercept::config(pCVar2);
    kernel_01 = enqueueCounter_00;
    this = pCVar2;
    if ((pSVar4->CallLogging & 1U) != 0) {
      kernel_00 = in_RDI;
      CLIntercept::enumName(pCVar2);
      CEnumNameMap::name_abi_cxx11_
                ((CEnumNameMap *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 (cl_int)((ulong)kernel_00 >> 0x20));
      uVar5 = std::__cxx11::string::c_str();
      CLIntercept::callLoggingEnter
                (pCVar2,"clSetKernelExecInfo",(uint64_t)enqueueCounter_00,kernel_00,
                 "param_name = %s (%08X)",uVar5,CONCAT44(uVar6,in_ESI));
      std::__cxx11::string::~string(local_58);
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffeb0);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffeb0);
    pSVar4 = CLIntercept::config(this);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(this), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffff80.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_70 = (CLIntercept *)in_stack_ffffffffffffff80.__d.__r;
    }
    local_4 = -0x3b;
    pSVar4 = CLIntercept::config(this);
    if ((pSVar4->Emulate_cl_intel_unified_shared_memory & 1U) != 0) {
      local_4 = CLIntercept::trackUSMKernelExecInfo
                          (this,kernel_01,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
    }
    if (local_4 != 0) {
      pcVar3 = CLIntercept::dispatch(this);
      local_4 = (*pcVar3->clSetKernelExecInfo)(in_RDI,in_ESI,in_RDX,in_RCX);
    }
    pSVar4 = CLIntercept::config(this);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(this), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      pCVar2 = (CLIntercept *)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffff70.__d.__r = (duration)(duration)pCVar2;
      pSVar4 = CLIntercept::config(this);
      if (((pSVar4->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,(uint64_t)kernel_01),
         bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff50,"",(allocator *)&stack0xffffffffffffff4f);
        end.__d.__r._4_4_ = local_4;
        end.__d.__r._0_4_ = in_stack_ffffffffffffff78;
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)in_stack_ffffffffffffff70.__d.__r,
                   (char *)in_stack_ffffffffffffff68.__d.__r,(string *)in_stack_ffffffffffffff60,
                   in_stack_ffffffffffffff80,end);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
        in_stack_ffffffffffffff38 = pCVar2;
        in_stack_ffffffffffffff40 = local_70;
      }
    }
    pSVar4 = CLIntercept::config(this);
    if (((((pSVar4->ErrorLogging & 1U) != 0) ||
         (pSVar4 = CLIntercept::config(this), (pSVar4->ErrorAssert & 1U) != 0)) ||
        (pSVar4 = CLIntercept::config(this), (pSVar4->NoErrors & 1U) != 0)) && (local_4 != 0)) {
      pSVar4 = CLIntercept::config(this);
      if ((pSVar4->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4);
      }
      pSVar4 = CLIntercept::config(this);
      if ((pSVar4->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar4 = CLIntercept::config(this);
      if ((pSVar4->NoErrors & 1U) != 0) {
        local_4 = 0;
      }
    }
    pSVar4 = CLIntercept::config(this);
    if ((pSVar4->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    }
    pSVar4 = CLIntercept::config(this);
    if ((pSVar4->ChromeCallLogging & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"",&local_e9);
      CLIntercept::chromeCallLoggingExit
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 (bool)in_stack_ffffffffffffff4f,(uint64_t)in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clSetKernelExecInfo) (
    cl_kernel kernel,
    cl_kernel_exec_info param_name,
    size_t param_value_size,
    const void* param_value)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clSetKernelExecInfo )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER_KERNEL( kernel, "param_name = %s (%08X)",
            pIntercept->enumName().name( param_name ).c_str(),
            param_name );
        HOST_PERFORMANCE_TIMING_START();

        cl_int  retVal = CL_INVALID_OPERATION;

        if( pIntercept->config().Emulate_cl_intel_unified_shared_memory )
        {
            retVal = pIntercept->trackUSMKernelExecInfo(
                kernel,
                param_name,
                param_value_size,
                param_value );
        }

        if( retVal != CL_SUCCESS )
        {
            retVal = pIntercept->dispatch().clSetKernelExecInfo(
                kernel,
                param_name,
                param_value_size,
                param_value );
        }

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( retVal );
        CALL_LOGGING_EXIT( retVal );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_KERNEL);
}